

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O0

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)4>(void)

{
  longlong alVar1 [8];
  vector_t<CPUType::AVX512BW,_int> input_00;
  char *__first;
  char *__last;
  longlong (*palVar2) [8];
  size_t sVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  AssertionHandler catchAssertionHandler;
  size_t i;
  qvector_t<(intgemm::CPUType)4,_int> result;
  AlignedVector<int> output;
  AlignedVector<signed_char> input;
  int LENGTH;
  undefined1 auVar6 [24];
  undefined1 in_stack_fffffffffffffac0 [64];
  ExprLhs<const_int_&> *in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffd78 [40];
  undefined1 in_stack_fffffffffffffda0 [16];
  longlong in_stack_fffffffffffffdb0;
  size_t local_208;
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  AlignedVector<int> local_78;
  AlignedVector<signed_char> local_68;
  undefined4 local_54;
  
  auVar6 = in_stack_fffffffffffffac0._8_24_;
  if (3 < kCPU) {
    local_54 = 0x40;
    AlignedVector<signed_char>::AlignedVector
              (in_stack_fffffffffffffac0._24_8_,in_stack_fffffffffffffac0._16_8_,
               in_stack_fffffffffffffac0._8_8_);
    AlignedVector<int>::AlignedVector(auVar6._16_8_,auVar6._8_8_,auVar6._0_8_);
    __first = AlignedVector<signed_char>::begin(&local_68);
    __last = AlignedVector<signed_char>::end(&local_68);
    std::iota<signed_char*,signed_char>(__first,__last,-0x20);
    palVar2 = AlignedVector<signed_char>::as<long_long__vector(8)>(&local_68);
    auVar4 = vmovdqa64_avx512f((undefined1  [64])*palVar2);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(auVar4);
    input_00[5] = in_stack_fffffffffffffda0._0_8_;
    input_00[6] = in_stack_fffffffffffffda0._8_8_;
    input_00[0] = in_stack_fffffffffffffd78._0_8_;
    input_00[1] = in_stack_fffffffffffffd78._8_8_;
    input_00[2] = in_stack_fffffffffffffd78._16_8_;
    input_00[3] = in_stack_fffffffffffffd78._24_8_;
    input_00[4] = in_stack_fffffffffffffd78._32_8_;
    input_00[7] = in_stack_fffffffffffffdb0;
    kernels::upcast8to32(input_00);
    auVar5 = vmovdqa64_avx512f(local_1c0);
    palVar2 = AlignedVector<int>::as<long_long__vector(8)>(&local_78);
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar5);
    *palVar2 = alVar1;
    auVar5 = vmovdqa64_avx512f(local_180);
    palVar2 = AlignedVector<int>::as<long_long__vector(8)>(&local_78);
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar5);
    palVar2[1] = alVar1;
    auVar5 = vmovdqa64_avx512f(local_140);
    palVar2 = AlignedVector<int>::as<long_long__vector(8)>(&local_78);
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar5);
    palVar2[2] = alVar1;
    auVar5 = vmovdqa64_avx512f(local_100);
    palVar2 = AlignedVector<int>::as<long_long__vector(8)>(&local_78);
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar5);
    palVar2[3] = alVar1;
    for (local_208 = 0; sVar3 = AlignedVector<int>::size(&local_78), local_208 < sVar3;
        local_208 = local_208 + 1) {
      operator____catch_sr(auVar4._8_8_,auVar4._0_8_);
      Catch::SourceLineInfo::SourceLineInfo
                ((SourceLineInfo *)&stack0xfffffffffffffd90,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
                 ,0x65);
      Catch::StringRef::StringRef(auVar4._24_8_,auVar4._16_8_);
      Catch::AssertionHandler::AssertionHandler
                (auVar4._24_8_,auVar4._16_8_,auVar4._8_8_,auVar4._32_16_,auVar4._4_4_);
      AlignedVector<int>::operator[](&local_78,local_208);
      Catch::Decomposer::operator<=(auVar4._0_8_,(int *)0x28a4f7);
      AlignedVector<signed_char>::operator[](&local_68,local_208);
      Catch::ExprLhs<int_const&>::operator==(in_stack_fffffffffffffb00,auVar4._56_8_);
      Catch::AssertionHandler::handleExpr(auVar4._8_8_,auVar4._0_8_);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_int_&,_const_int_&> *)0x28a579);
      Catch::AssertionHandler::complete(auVar4._8_8_);
      Catch::AssertionHandler::~AssertionHandler(auVar4._8_8_);
    }
    AlignedVector<int>::~AlignedVector((AlignedVector<int> *)0x28a694);
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x28a6a1);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}